

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::MarkTemp(BackwardPass *this,StackSym *sym)

{
  BasicBlock *pBVar1;
  Loop *pLVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  BasicBlock *block;
  StackSym *sym_local;
  BackwardPass *this_local;
  
  bVar4 = IsCollectionPass(this);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x190f,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar4 = StackSym::IsVar(sym);
  if (bVar4) {
    pBVar1 = this->currentBlock;
    bVar4 = DoMarkTempNumbers(this);
    if (bVar4) {
      pLVar2 = pBVar1->loop;
      bVar4 = TempTrackerBase::HasTempTransferDependencies
                        ((TempTrackerBase *)pBVar1->tempNumberTracker);
      if ((pLVar2 != (Loop *)0x0) != bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1919,
                           "((block->loop != nullptr) == block->tempNumberTracker->HasTempTransferDependencies())"
                           ,
                           "(block->loop != nullptr) == block->tempNumberTracker->HasTempTransferDependencies()"
                          );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      TempTracker<NumberTemp>::MarkTemp(pBVar1->tempNumberTracker,sym,this);
    }
    bVar4 = DoMarkTempObjects(this);
    if (bVar4) {
      pLVar2 = pBVar1->loop;
      bVar4 = TempTrackerBase::HasTempTransferDependencies
                        ((TempTrackerBase *)pBVar1->tempObjectTracker);
      if ((pLVar2 != (Loop *)0x0) != bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x191e,
                           "((block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies())"
                           ,
                           "(block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies()"
                          );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      TempTracker<ObjectTemp>::MarkTemp(pBVar1->tempObjectTracker,sym,this);
    }
    bVar4 = DoMarkTempObjectVerify(this);
    if (bVar4) {
      pLVar2 = pBVar1->loop;
      bVar4 = TempTrackerBase::HasTempTransferDependencies
                        ((TempTrackerBase *)pBVar1->tempObjectVerifyTracker);
      if ((pLVar2 != (Loop *)0x0) != bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1924,
                           "((block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies())"
                           ,
                           "(block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies()"
                          );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      TempTracker<ObjectTempVerify>::MarkTemp(pBVar1->tempObjectVerifyTracker,sym,this);
    }
  }
  return;
}

Assistant:

void
BackwardPass::MarkTemp(StackSym * sym)
{
    Assert(!IsCollectionPass());
    // Don't care about type specialized syms
    if (!sym->IsVar())
    {
        return;
    }

    BasicBlock * block = this->currentBlock;
    if (this->DoMarkTempNumbers())
    {
        Assert((block->loop != nullptr) == block->tempNumberTracker->HasTempTransferDependencies());
        block->tempNumberTracker->MarkTemp(sym, this);
    }
    if (this->DoMarkTempObjects())
    {
        Assert((block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies());
        block->tempObjectTracker->MarkTemp(sym, this);
    }
#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        Assert((block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies());
        block->tempObjectVerifyTracker->MarkTemp(sym, this);
    }
#endif
}